

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridDataType1::Decode(GridDataType1 *this,KDataStream *stream)

{
  ushort uVar1;
  pointer puVar2;
  KUINT16 KVar3;
  KException *this_00;
  KUINT16 i;
  ushort uVar4;
  allocator<char> local_51;
  KUINT16 tmp;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (0xd < KVar3) {
    puVar2 = (this->m_vui16Values).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    GridData::Decode(&this->super_GridData,stream);
    KDataStream::Read<float>(stream,(float *)&(this->super_GridData).field_0xc);
    KDataStream::Read<float>(stream,(float *)&this->m_f32FieldOffset);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumValues);
    tmp = 0;
    for (uVar4 = 0; uVar1 = this->m_ui16NumValues, uVar4 < uVar1; uVar4 = uVar4 + 1) {
      KDataStream::Read<unsigned_short>(stream,&tmp);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this->m_vui16Values,&tmp);
    }
    if ((uVar1 & 1) != 0) {
      KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,"Decode",&local_51);
  KException::KException(this_00,(KString *)&tmp,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridDataType1::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE1_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui16Values.clear();

    GridData::Decode( stream );

    stream >> m_f32FieldScale
           >> m_f32FieldOffset
           >> m_ui16NumValues;

    KUINT16 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vui16Values.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumValues % 2 == 1 )
    {
        stream >> m_ui16Padding;
    }
}